

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3InsertData(Fts3Table *p,sqlite3_value **apVal,sqlite3_int64 *piDocid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sqlite3_value *psVar6;
  sqlite3_stmt *psVar7;
  int iVar8;
  i64 iVar9;
  sqlite3_value *psVar10;
  long in_FS_OFFSET;
  sqlite3_stmt *pContentInsert;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
  if (p->zContentTbl == (char *)0x0) {
    iVar8 = fts3SqlStmt(p,0x12,&local_40,apVal + 1);
    psVar7 = local_40;
    if (iVar8 == 0) {
      if (p->zLanguageid == (char *)0x0) {
        iVar8 = 0;
      }
      else {
        iVar8 = p->nColumn;
        iVar9 = sqlite3VdbeIntValue(apVal[(long)iVar8 + 4]);
        iVar8 = sqlite3_bind_int64(psVar7,iVar8 + 2,(long)(int)iVar9);
      }
    }
    if (iVar8 != 0) goto LAB_001d025c;
    psVar10 = apVal[(long)p->nColumn + 3];
    uVar3._0_2_ = psVar10->flags;
    uVar3._2_1_ = psVar10->enc;
    uVar3._3_1_ = psVar10->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      psVar6 = *apVal;
      uVar4._0_2_ = psVar6->flags;
      uVar4._2_1_ = psVar6->enc;
      uVar4._3_1_ = psVar6->eSubtype;
      if (((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar4 & 0x3f) & 1) != 0) &&
         (psVar6 = apVal[1], uVar5._0_2_ = psVar6->flags, uVar5._2_1_ = psVar6->enc,
         uVar5._3_1_ = psVar6->eSubtype, iVar8 = 1,
         (0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar5 & 0x3f) & 1) == 0)) goto LAB_001d025c;
      iVar8 = sqlite3_bind_value(local_40,1,psVar10);
      if (iVar8 != 0) goto LAB_001d025c;
    }
    psVar7 = local_40;
    sqlite3_step(local_40);
    iVar8 = sqlite3_reset(psVar7);
    iVar9 = p->db->lastRowid;
  }
  else {
    psVar10 = apVal[(long)p->nColumn + 3];
    uVar1._0_2_ = psVar10->flags;
    uVar1._2_1_ = psVar10->enc;
    uVar1._3_1_ = psVar10->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) != 0) {
      psVar10 = apVal[1];
    }
    uVar2._0_2_ = psVar10->flags;
    uVar2._2_1_ = psVar10->enc;
    uVar2._3_1_ = psVar10->eSubtype;
    iVar8 = 0x13;
    if ((0x50505050UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_001d025c;
    iVar9 = sqlite3VdbeIntValue(psVar10);
    iVar8 = 0;
  }
  *piDocid = iVar9;
LAB_001d025c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar8;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3InsertData(
  Fts3Table *p,                   /* Full-text table */
  sqlite3_value **apVal,          /* Array of values to insert */
  sqlite3_int64 *piDocid          /* OUT: Docid for row just inserted */
){
  int rc;                         /* Return code */
  sqlite3_stmt *pContentInsert;   /* INSERT INTO %_content VALUES(...) */

  if( p->zContentTbl ){
    sqlite3_value *pRowid = apVal[p->nColumn+3];
    if( sqlite3_value_type(pRowid)==SQLITE_NULL ){
      pRowid = apVal[1];
    }
    if( sqlite3_value_type(pRowid)!=SQLITE_INTEGER ){
      return SQLITE_CONSTRAINT;
    }
    *piDocid = sqlite3_value_int64(pRowid);
    return SQLITE_OK;
  }

  /* Locate the statement handle used to insert data into the %_content
  ** table. The SQL for this statement is:
  **
  **   INSERT INTO %_content VALUES(?, ?, ?, ...)
  **
  ** The statement features N '?' variables, where N is the number of user
  ** defined columns in the FTS3 table, plus one for the docid field.
  */
  rc = fts3SqlStmt(p, SQL_CONTENT_INSERT, &pContentInsert, &apVal[1]);
  if( rc==SQLITE_OK && p->zLanguageid ){
    rc = sqlite3_bind_int(
        pContentInsert, p->nColumn+2,
        sqlite3_value_int(apVal[p->nColumn+4])
    );
  }
  if( rc!=SQLITE_OK ) return rc;

  /* There is a quirk here. The users INSERT statement may have specified
  ** a value for the "rowid" field, for the "docid" field, or for both.
  ** Which is a problem, since "rowid" and "docid" are aliases for the
  ** same value. For example:
  **
  **   INSERT INTO fts3tbl(rowid, docid) VALUES(1, 2);
  **
  ** In FTS3, this is an error. It is an error to specify non-NULL values
  ** for both docid and some other rowid alias.
  */
  if( SQLITE_NULL!=sqlite3_value_type(apVal[3+p->nColumn]) ){
    if( SQLITE_NULL==sqlite3_value_type(apVal[0])
     && SQLITE_NULL!=sqlite3_value_type(apVal[1])
    ){
      /* A rowid/docid conflict. */
      return SQLITE_ERROR;
    }
    rc = sqlite3_bind_value(pContentInsert, 1, apVal[3+p->nColumn]);
    if( rc!=SQLITE_OK ) return rc;
  }

  /* Execute the statement to insert the record. Set *piDocid to the
  ** new docid value.
  */
  sqlite3_step(pContentInsert);
  rc = sqlite3_reset(pContentInsert);

  *piDocid = sqlite3_last_insert_rowid(p->db);
  return rc;
}